

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

StatementNode * __thiscall DL::Parser::gr_array(Parser *this)

{
  StatementNode *pSVar1;
  vector_t<DataNode_*> local_38;
  
  pSVar1 = (StatementNode *)operator_new(0x38);
  (pSVar1->Name)._M_dataplus._M_p = (pointer)&(pSVar1->Name).field_2;
  (pSVar1->Name)._M_string_length = 0;
  (pSVar1->Name).field_2._M_local_buf[0] = '\0';
  (pSVar1->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar1->Nodes).super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)pSVar1,0,(char *)0x0,0x112730);
  gr_data_list(&local_38,this);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::_M_move_assign
            (&pSVar1->Nodes,&local_38);
  if (local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pSVar1;
}

Assistant:

StatementNode* Parser::gr_array()
{
	StatementNode* node = new StatementNode;

	node->Name  = "";
	node->Nodes = gr_data_list();

	return node;
}